

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::manager>
::deactivate(basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::manager>
             *this,timer_holder *timer)

{
  reference_counter_type *prVar1;
  timer_object_holder<timertt::thread_safety::unsafe> local_10;
  
  local_10.m_timer = timer->m_timer;
  if (local_10.m_timer != (timer_object<timertt::thread_safety::unsafe> *)0x0) {
    (local_10.m_timer)->m_references = (local_10.m_timer)->m_references + 1;
  }
  timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::deactivate(&this->m_engine,&local_10);
  if (local_10.m_timer != (timer_object<timertt::thread_safety::unsafe> *)0x0) {
    prVar1 = &(local_10.m_timer)->m_references;
    *prVar1 = *prVar1 - 1;
    if (*prVar1 == 0) {
      (*(local_10.m_timer)->_vptr_timer_object[1])();
    }
  }
  return;
}

Assistant:

inline timer_object_holder( const timer_object_holder & o )
		:	m_timer( o.m_timer )
	{
		take_object();
	}